

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O2

void prepare_horizontal_filter_coeff_alpha0_avx2(int beta,int sx,__m256i *coeff)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  undefined1 auVar4 [32];
  
  auVar5._8_8_ = 0;
  auVar5._0_8_ = av1_filter_8bit[beta + sx >> 10];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = av1_filter_8bit[sx >> 10];
  auVar4._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar3;
  auVar4._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
  auVar2 = vpshuflw_avx2(auVar4,0);
  alVar1 = (__m256i)vpshufd_avx2(auVar2,0);
  *coeff = alVar1;
  auVar2 = vpshuflw_avx2(auVar4,0x55);
  alVar1 = (__m256i)vpshufd_avx2(auVar2,0);
  coeff[1] = alVar1;
  auVar2 = vpshuflw_avx2(auVar4,0xaa);
  alVar1 = (__m256i)vpshufd_avx2(auVar2,0);
  coeff[2] = alVar1;
  auVar2 = vpshuflw_avx2(auVar4,0xff);
  alVar1 = (__m256i)vpshufd_avx2(auVar2,0);
  coeff[3] = alVar1;
  return;
}

Assistant:

static inline void prepare_horizontal_filter_coeff_alpha0_avx2(int beta, int sx,
                                                               __m256i *coeff) {
  const __m128i tmp_0 =
      _mm_loadl_epi64((__m128i *)&av1_filter_8bit[sx >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_1 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + beta) >> WARPEDDIFF_PREC_BITS]);

  const __m256i res_0 =
      _mm256_inserti128_si256(_mm256_castsi128_si256(tmp_0), tmp_1, 0x1);

  coeff[0] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_alpha0_mask01_avx2));
  coeff[1] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_alpha0_mask23_avx2));
  coeff[2] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_alpha0_mask45_avx2));
  coeff[3] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_alpha0_mask67_avx2));
}